

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

int findLocation(string *str,int begin,int end,char op)

{
  char cVar1;
  bool bVar2;
  runtime_error *this;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  bVar2 = begin < end;
  if (begin < end) {
    lVar3 = (long)end;
    lVar4 = (long)begin;
    iVar6 = end + -1;
    iVar5 = 0;
    do {
      cVar1 = (str->_M_dataplus)._M_p[lVar3 + -1];
      if (cVar1 == '(') {
        if (iVar5 < 1) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"parentheses mismatch");
          goto LAB_0010848a;
        }
        iVar5 = iVar5 + -1;
LAB_00108403:
        bVar7 = false;
      }
      else {
        if (cVar1 == ')') {
          iVar5 = iVar5 + 1;
          goto LAB_00108403;
        }
        bVar7 = false;
        if (iVar5 < 1) {
          bVar7 = cVar1 == op;
          if (bVar7) {
            begin = iVar6;
          }
        }
      }
      if (bVar7) break;
      lVar3 = lVar3 + -1;
      iVar6 = iVar6 + -1;
      bVar2 = lVar4 < lVar3;
    } while (lVar4 < lVar3);
    bVar7 = iVar5 < 1;
  }
  else {
    bVar7 = true;
  }
  if (bVar7 || bVar2) {
    if (bVar2) {
      end = begin;
    }
    return end;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"parentheses mismatch");
LAB_0010848a:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int findLocation(const std::string& str, int begin, int end, char op)
{
  int level = 0;
  for (int i=end-1; i>=begin; --i) {
    char c = str[i];
    if (c == ')') {
      ++level;
      continue;
    }
    if (c == '(') {
      --level;
      if (level < 0)
        throw std::runtime_error("parentheses mismatch");
      continue;
    }
    if (level > 0) continue;
    if (c == op)
      return i;
  }
  if (level > 0) throw std::runtime_error("parentheses mismatch");
  return end;
}